

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  undefined1 auVar1 [16];
  uint uVar2;
  stbi_uc *psVar3;
  long lVar4;
  float *pfVar5;
  stbi_uc *psVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var [60];
  
  if (data != (float *)0x0) {
    psVar3 = (stbi_uc *)stbi__malloc_mad3(x,y,comp,0);
    if (psVar3 != (stbi_uc *)0x0) {
      if (0 < y * x) {
        lVar7 = (long)comp;
        auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar10 = 0;
        uVar8 = comp + -1 + (comp & 1U);
        pfVar5 = data;
        psVar6 = psVar3;
        do {
          uVar2 = 0;
          if (0 < (int)uVar8) {
            uVar9 = 0;
            do {
              auVar11._0_4_ = powf(pfVar5[uVar9] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
              auVar11._4_60_ = extraout_var;
              auVar12 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar1 = vfmadd213ss_fma(auVar11._0_16_,SUB6416(ZEXT464(0x437f0000),0),
                                       SUB6416(ZEXT464(0x3f000000),0));
              auVar1 = vmaxss_avx(ZEXT816(0) << 0x40,auVar1);
              auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar1);
              psVar6[uVar9] = (stbi_uc)(int)auVar1._0_4_;
              uVar9 = uVar9 + 1;
              uVar2 = uVar8;
            } while (uVar8 != uVar9);
          }
          if ((int)uVar2 < comp) {
            lVar4 = (ulong)uVar2 + uVar10 * lVar7;
            auVar1 = vfmadd132ss_fma(ZEXT416((uint)data[lVar4]),SUB6416(ZEXT464(0x3f000000),0),
                                     SUB6416(ZEXT464(0x437f0000),0));
            auVar1 = vmaxss_avx(auVar12._0_16_,auVar1);
            auVar1 = vminss_avx(SUB6416(ZEXT464(0x437f0000),0),auVar1);
            psVar3[lVar4] = (stbi_uc)(int)auVar1._0_4_;
          }
          pfVar5 = pfVar5 + lVar7;
          uVar10 = uVar10 + 1;
          psVar6 = psVar6 + lVar7;
        } while (uVar10 != (uint)(y * x));
      }
      free(data);
      return psVar3;
    }
    free(data);
    stbi__g_failure_reason = "outofmem";
  }
  return (stbi_uc *)0x0;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output;
   if (!data) return NULL;
   output = (stbi_uc *) stbi__malloc_mad3(x, y, comp, 0);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}